

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::typeName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Type type,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  uint uVar1;
  uint64_t id;
  Reader brand;
  Which WVar2;
  Which WVar3;
  uint uVar4;
  NullableValue<capnp::Type::BrandParameter> *other;
  BrandParameter *pBVar5;
  NullableValue<capnp::Type::ImplicitParameter> *other_00;
  ImplicitParameter *pIVar6;
  uint *puVar7;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  ListSchema LVar8;
  StringPtr local_5c8;
  StringPtr local_5b8;
  StringPtr local_5a8;
  StringPtr local_598;
  StringPtr local_588;
  Reader local_578;
  ArrayPtr<const_char> local_548;
  ArrayPtr<const_char> local_538;
  Fault local_528;
  Fault f;
  undefined1 local_4f0 [8];
  Reader params_1;
  Method *m;
  NullableValue<capnp::Type::ImplicitParameter> local_4ac;
  NullableValue<capnp::Type::ImplicitParameter> local_4a4;
  Reader local_498;
  Schema local_460;
  Reader local_458;
  Reader local_428;
  Reader local_3f8;
  ArrayPtr<const_char> local_3c8;
  ArrayPtr<const_char> local_3b8;
  Maybe<capnp::Type::BrandParameter> local_3a8;
  undefined1 local_390 [8];
  NullableValue<capnp::Type::BrandParameter> param;
  ArrayPtr<const_char> local_360;
  CppTypeName local_350;
  Maybe<capnp::InterfaceSchema::Method> local_310;
  Type local_2c8;
  CppTypeName local_2b8;
  undefined1 local_278 [8];
  ListSchema list;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> params;
  char *local_240;
  Maybe<capnp::InterfaceSchema::Method> local_230;
  Schema local_1e8;
  Schema local_1e0;
  undefined1 local_1d1;
  Maybe<capnp::InterfaceSchema::Method> local_1d0;
  Schema local_188;
  Schema local_180;
  Maybe<capnp::InterfaceSchema::Method> local_168;
  Schema local_120;
  Schema local_118;
  StringPtr local_110;
  StringPtr local_100;
  StringPtr local_f0;
  StringPtr local_e0;
  StringPtr local_d0;
  StringPtr local_c0;
  StringPtr local_b0;
  StringPtr local_a0;
  StringPtr local_90;
  StringPtr local_80;
  StringPtr local_70;
  StringPtr local_60;
  StringPtr local_50;
  StringPtr local_40;
  Maybe<capnp::InterfaceSchema::Method> *local_30;
  Maybe<capnp::InterfaceSchema::Method> *method_local;
  CapnpcCppMain *this_local;
  Type type_local;
  CppTypeName *result;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  local_30 = method;
  method_local = (Maybe<capnp::InterfaceSchema::Method> *)this;
  type_local.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  WVar2 = capnp::Type::which((Type *)&this_local);
  puVar7 = &switchD_00206b64::switchdataD_00417094;
  switch(WVar2) {
  case VOID:
    kj::StringPtr::StringPtr(&local_40," ::capnp::Void");
    name.content.size_ = (size_t)puVar7;
    name.content.ptr = (char *)local_40.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_40.content.ptr,name);
    break;
  case BOOL:
    kj::StringPtr::StringPtr(&local_50,"bool");
    name_00.content.size_ = (size_t)puVar7;
    name_00.content.ptr = (char *)local_50.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_50.content.ptr,name_00);
    break;
  case INT8:
    kj::StringPtr::StringPtr(&local_60," ::int8_t");
    name_01.content.size_ = (size_t)puVar7;
    name_01.content.ptr = (char *)local_60.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_60.content.ptr,name_01);
    break;
  case INT16:
    kj::StringPtr::StringPtr(&local_70," ::int16_t");
    name_02.content.size_ = (size_t)puVar7;
    name_02.content.ptr = (char *)local_70.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_70.content.ptr,name_02);
    break;
  case INT32:
    kj::StringPtr::StringPtr(&local_80," ::int32_t");
    name_03.content.size_ = (size_t)puVar7;
    name_03.content.ptr = (char *)local_80.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_80.content.ptr,name_03);
    break;
  case INT64:
    kj::StringPtr::StringPtr(&local_90," ::int64_t");
    name_04.content.size_ = (size_t)puVar7;
    name_04.content.ptr = (char *)local_90.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_90.content.ptr,name_04);
    break;
  case UINT8:
    kj::StringPtr::StringPtr(&local_a0," ::uint8_t");
    name_05.content.size_ = (size_t)puVar7;
    name_05.content.ptr = (char *)local_a0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_a0.content.ptr,name_05);
    break;
  case UINT16:
    kj::StringPtr::StringPtr(&local_b0," ::uint16_t");
    name_06.content.size_ = (size_t)puVar7;
    name_06.content.ptr = (char *)local_b0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_b0.content.ptr,name_06);
    break;
  case UINT32:
    kj::StringPtr::StringPtr(&local_c0," ::uint32_t");
    name_07.content.size_ = (size_t)puVar7;
    name_07.content.ptr = (char *)local_c0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_c0.content.ptr,name_07);
    break;
  case UINT64:
    kj::StringPtr::StringPtr(&local_d0," ::uint64_t");
    name_08.content.size_ = (size_t)puVar7;
    name_08.content.ptr = (char *)local_d0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_d0.content.ptr,name_08);
    break;
  case FLOAT32:
    kj::StringPtr::StringPtr(&local_e0,"float");
    name_09.content.size_ = (size_t)puVar7;
    name_09.content.ptr = (char *)local_e0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_e0.content.ptr,name_09);
    break;
  case FLOAT64:
    kj::StringPtr::StringPtr(&local_f0,"double");
    name_10.content.size_ = (size_t)puVar7;
    name_10.content.ptr = (char *)local_f0.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_f0.content.ptr,name_10);
    break;
  case TEXT:
    kj::StringPtr::StringPtr(&local_100," ::capnp::Text");
    name_11.content.size_ = (size_t)puVar7;
    name_11.content.ptr = (char *)local_100.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_100.content.ptr,name_11);
    break;
  case DATA:
    kj::StringPtr::StringPtr(&local_110," ::capnp::Data");
    name_12.content.size_ = (size_t)puVar7;
    name_12.content.ptr = (char *)local_110.content.size_;
    CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)local_110.content.ptr,name_12);
    break;
  case LIST:
    kj::StringPtr::StringPtr((StringPtr *)&params.disposer,"capnp");
    name_13.content.size_ = (size_t)puVar7;
    name_13.content.ptr = local_240;
    CppTypeName::makeNamespace(__return_storage_ptr__,(CppTypeName *)params.disposer,name_13);
    kj::heapArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&list.elementType.field_4,
               2);
    LVar8 = capnp::Type::asList((Type *)&this_local);
    list.elementType._0_8_ = LVar8.elementType.field_4;
    local_278 = LVar8.elementType._0_8_;
    local_2c8 = ListSchema::getElementType((ListSchema *)local_278);
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_310,method);
    typeName(&local_2b8,this,local_2c8,&local_310);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::
    add<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&list.elementType.field_4,
               &local_2b8);
    CppTypeName::~CppTypeName(&local_2b8);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_310);
    WVar2 = ListSchema::whichElementType((ListSchema *)local_278);
    whichKind(&local_350,WVar2);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::
    add<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&list.elementType.field_4,
               &local_350);
    CppTypeName::~CppTypeName(&local_350);
    kj::StringPtr::StringPtr((StringPtr *)&local_360,"List");
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::finish
              ((Array<capnp::(anonymous_namespace)::CppTypeName> *)((long)&param.field_1 + 8),
               (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&list.elementType.field_4)
    ;
    CppTypeName::addMemberTemplate
              (__return_storage_ptr__,(StringPtr)local_360,
               (Array<capnp::(anonymous_namespace)::CppTypeName> *)((long)&param.field_1 + 8));
    kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
              ((Array<capnp::(anonymous_namespace)::CppTypeName> *)((long)&param.field_1 + 8));
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&list.elementType.field_4)
    ;
    break;
  case ENUM:
    local_120.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&this_local);
    local_118.raw = local_120.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_168,method);
    cppFullName(__return_storage_ptr__,this,local_118,&local_168);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_168);
    break;
  case STRUCT:
    local_188.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&this_local);
    local_180.raw = local_188.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_1d0,method);
    cppFullName(__return_storage_ptr__,this,local_180,&local_1d0);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_1d0);
    break;
  case INTERFACE:
    local_1d1 = 0;
    local_1e8.raw = (RawBrandedSchema *)capnp::Type::asInterface((Type *)&this_local);
    local_1e0.raw = local_1e8.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_230,method);
    cppFullName(__return_storage_ptr__,this,local_1e0,&local_230);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_230);
    CppTypeName::setHasInterfaces(__return_storage_ptr__);
    break;
  case ANY_POINTER:
    capnp::Type::getBrandParameter(&local_3a8,(Type *)&this_local);
    other = kj::_::readMaybe<capnp::Type::BrandParameter>(&local_3a8);
    kj::_::NullableValue<capnp::Type::BrandParameter>::NullableValue
              ((NullableValue<capnp::Type::BrandParameter> *)local_390,other);
    kj::Maybe<capnp::Type::BrandParameter>::~Maybe(&local_3a8);
    pBVar5 = kj::_::NullableValue::operator_cast_to_BrandParameter_((NullableValue *)local_390);
    if (pBVar5 == (BrandParameter *)0x0) {
      capnp::Type::getImplicitParameter((Type *)((long)&m + 4));
      other_00 = kj::_::readMaybe<capnp::Type::ImplicitParameter>
                           ((Maybe<capnp::Type::ImplicitParameter> *)((long)&m + 4));
      kj::_::NullableValue<capnp::Type::ImplicitParameter>::NullableValue(&local_4ac,other_00);
      kj::Maybe<capnp::Type::ImplicitParameter>::~Maybe
                ((Maybe<capnp::Type::ImplicitParameter> *)((long)&m + 4));
      pIVar6 = kj::_::NullableValue::operator_cast_to_ImplicitParameter_
                         ((NullableValue *)&local_4ac);
      if (pIVar6 == (ImplicitParameter *)0x0) {
        WVar3 = capnp::Type::whichAnyPointerKind((Type *)&this_local);
        puVar7 = &switchD_002077ad::switchdataD_004170e0;
        switch(WVar3) {
        case ANY_KIND:
          kj::StringPtr::StringPtr(&local_598," ::capnp::AnyPointer");
          name_17.content.size_ = (size_t)puVar7;
          name_17.content.ptr = (char *)local_598.content.size_;
          CppTypeName::makePrimitive
                    (__return_storage_ptr__,(CppTypeName *)local_598.content.ptr,name_17);
          break;
        case STRUCT:
          kj::StringPtr::StringPtr(&local_5a8," ::capnp::AnyStruct");
          name_18.content.size_ = (size_t)puVar7;
          name_18.content.ptr = (char *)local_5a8.content.size_;
          CppTypeName::makePrimitive
                    (__return_storage_ptr__,(CppTypeName *)local_5a8.content.ptr,name_18);
          break;
        case LIST:
          kj::StringPtr::StringPtr(&local_5b8," ::capnp::AnyList");
          name_19.content.size_ = (size_t)puVar7;
          name_19.content.ptr = (char *)local_5b8.content.size_;
          CppTypeName::makePrimitive
                    (__return_storage_ptr__,(CppTypeName *)local_5b8.content.ptr,name_19);
          break;
        case CAPABILITY:
          this->hasInterfaces = true;
          kj::StringPtr::StringPtr(&local_5c8," ::capnp::Capability");
          name_20.content.size_ = (size_t)puVar7;
          name_20.content.ptr = (char *)local_5c8.content.size_;
          CppTypeName::makePrimitive
                    (__return_storage_ptr__,(CppTypeName *)local_5c8.content.ptr,name_20);
          break;
        default:
          kj::_::unreachable();
        }
      }
      else {
        params_1.reader._40_8_ = kj::_::readMaybe<capnp::InterfaceSchema::Method>(method);
        if ((Method *)params_1.reader._40_8_ == (Method *)0x0) {
          kj::StringPtr::StringPtr(&local_588," ::capnp::AnyPointer");
          name_16.content.size_ = (size_t)puVar7;
          name_16.content.ptr = (char *)local_588.content.size_;
          CppTypeName::makePrimitive
                    (__return_storage_ptr__,(CppTypeName *)local_588.content.ptr,name_16);
        }
        else {
          InterfaceSchema::Method::getProto((Reader *)&f,(Method *)params_1.reader._40_8_);
          capnp::schema::Method::Reader::getImplicitParameters((Reader *)local_4f0,(Reader *)&f);
          pIVar6 = kj::_::NullableValue<capnp::Type::ImplicitParameter>::operator->(&local_4ac);
          uVar1 = pIVar6->index;
          uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size
                            ((Reader *)local_4f0);
          if (uVar4 <= uVar1) {
            kj::_::Debug::Fault::Fault
                      (&local_528,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                       ,0x210,FAILED,"param->index < params.size()","");
            kj::_::Debug::Fault::fatal(&local_528);
          }
          pIVar6 = kj::_::NullableValue<capnp::Type::ImplicitParameter>::operator->(&local_4ac);
          List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::operator[]
                    (&local_578,(Reader *)local_4f0,pIVar6->index);
          local_548 = (ArrayPtr<const_char>)
                      capnp::schema::Node::Parameter::Reader::getName(&local_578);
          name_15.content.ptr = (char *)local_548.size_;
          name_15.content.size_ = (size_t)local_548.ptr;
          local_538 = local_548;
          CppTypeName::makeTemplateParam
                    (__return_storage_ptr__,(CppTypeName *)local_548.ptr,name_15);
        }
      }
      local_4a4.isSet = true;
      local_4a4._1_3_ = 0;
      kj::_::NullableValue<capnp::Type::ImplicitParameter>::~NullableValue(&local_4ac);
    }
    else {
      pBVar5 = kj::_::NullableValue<capnp::Type::BrandParameter>::operator->
                         ((NullableValue<capnp::Type::BrandParameter> *)local_390);
      id = pBVar5->scopeId;
      local_498._reader.dataSize = 0;
      local_498._reader.pointerCount = 0;
      local_498._reader._38_2_ = 0;
      local_498._reader.nestingLimit = 0;
      local_498._reader._44_4_ = 0;
      local_498._reader.data = (void *)0x0;
      local_498._reader.pointers = (WirePointer *)0x0;
      local_498._reader.segment = (SegmentReader *)0x0;
      local_498._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_498);
      Schema::Schema((Schema *)&local_4a4.field_1.value);
      brand._reader.capTable = local_498._reader.capTable;
      brand._reader.segment = local_498._reader.segment;
      brand._reader.data = local_498._reader.data;
      brand._reader.pointers = local_498._reader.pointers;
      brand._reader.dataSize = local_498._reader.dataSize;
      brand._reader.pointerCount = local_498._reader.pointerCount;
      brand._reader._38_2_ = local_498._reader._38_2_;
      brand._reader.nestingLimit = local_498._reader.nestingLimit;
      brand._reader._44_4_ = local_498._reader._44_4_;
      local_460 = SchemaLoader::get(&this->schemaLoader,id,brand,stack0xfffffffffffffb60);
      Schema::getProto(&local_458,&local_460);
      capnp::schema::Node::Reader::getParameters(&local_428,&local_458);
      pBVar5 = kj::_::NullableValue<capnp::Type::BrandParameter>::operator->
                         ((NullableValue<capnp::Type::BrandParameter> *)local_390);
      List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::operator[]
                (&local_3f8,&local_428,pBVar5->index);
      local_3c8 = (ArrayPtr<const_char>)capnp::schema::Node::Parameter::Reader::getName(&local_3f8);
      name_14.content.ptr = (char *)local_3c8.size_;
      name_14.content.size_ = (size_t)local_3c8.ptr;
      local_3b8 = local_3c8;
      CppTypeName::makeTemplateParam(__return_storage_ptr__,(CppTypeName *)local_3c8.ptr,name_14);
      local_4a4.isSet = true;
      local_4a4._1_3_ = 0;
    }
    kj::_::NullableValue<capnp::Type::BrandParameter>::~NullableValue
              ((NullableValue<capnp::Type::BrandParameter> *)local_390);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

CppTypeName typeName(Type type, kj::Maybe<InterfaceSchema::Method> method) {
    switch (type.which()) {
      case schema::Type::VOID: return CppTypeName::makePrimitive(" ::capnp::Void");

      case schema::Type::BOOL: return CppTypeName::makePrimitive("bool");
      case schema::Type::INT8: return CppTypeName::makePrimitive(" ::int8_t");
      case schema::Type::INT16: return CppTypeName::makePrimitive(" ::int16_t");
      case schema::Type::INT32: return CppTypeName::makePrimitive(" ::int32_t");
      case schema::Type::INT64: return CppTypeName::makePrimitive(" ::int64_t");
      case schema::Type::UINT8: return CppTypeName::makePrimitive(" ::uint8_t");
      case schema::Type::UINT16: return CppTypeName::makePrimitive(" ::uint16_t");
      case schema::Type::UINT32: return CppTypeName::makePrimitive(" ::uint32_t");
      case schema::Type::UINT64: return CppTypeName::makePrimitive(" ::uint64_t");
      case schema::Type::FLOAT32: return CppTypeName::makePrimitive("float");
      case schema::Type::FLOAT64: return CppTypeName::makePrimitive("double");

      case schema::Type::TEXT: return CppTypeName::makePrimitive(" ::capnp::Text");
      case schema::Type::DATA: return CppTypeName::makePrimitive(" ::capnp::Data");

      case schema::Type::ENUM:
        return cppFullName(type.asEnum(), method);
      case schema::Type::STRUCT:
        return cppFullName(type.asStruct(), method);
      case schema::Type::INTERFACE: {
        auto result = cppFullName(type.asInterface(), method);
        result.setHasInterfaces();
        return result;
      }

      case schema::Type::LIST: {
        CppTypeName result = CppTypeName::makeNamespace("capnp");
        auto params = kj::heapArrayBuilder<CppTypeName>(2);
        auto list = type.asList();
        params.add(typeName(list.getElementType(), method));
        params.add(whichKind(list.whichElementType()));
        result.addMemberTemplate("List", params.finish());
        return result;
      }

      case schema::Type::ANY_POINTER:
        KJ_IF_MAYBE(param, type.getBrandParameter()) {
          return CppTypeName::makeTemplateParam(schemaLoader.get(param->scopeId).getProto()
              .getParameters()[param->index].getName());
        } else KJ_IF_MAYBE(param, type.getImplicitParameter()) {
          KJ_IF_MAYBE(m, method) {
            auto params = m->getProto().getImplicitParameters();
            KJ_REQUIRE(param->index < params.size());
            return CppTypeName::makeTemplateParam(params[param->index].getName());
          } else {
            return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
          }
        } else {
          switch (type.whichAnyPointerKind()) {
            case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
              return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
            case schema::Type::AnyPointer::Unconstrained::STRUCT:
              return CppTypeName::makePrimitive(" ::capnp::AnyStruct");
            case schema::Type::AnyPointer::Unconstrained::LIST:
              return CppTypeName::makePrimitive(" ::capnp::AnyList");
            case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
              hasInterfaces = true;  // Probably need to #include <capnp/capability.h>.
              return CppTypeName::makePrimitive(" ::capnp::Capability");
          }